

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O2

void __thiscall
Centaurus::Grammar<wchar_t>::print_ldfa(Grammar<wchar_t> *this,wostream *os,ATNPath *path)

{
  LookaheadDFA<wchar_t> ldfa;
  CompositeATN<wchar_t> catn;
  
  CompositeATN<wchar_t>::CompositeATN(&catn,this);
  LookaheadDFA<wchar_t>::LookaheadDFA(&ldfa,&catn,path,true);
  LookaheadDFA<wchar_t>::print
            (&ldfa,os,&(path->
                       super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                       ).
                       super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].first.m_id);
  NFABase<Centaurus::LDFAState<wchar_t>_>::~NFABase
            (&ldfa.super_NFABase<Centaurus::LDFAState<wchar_t>_>);
  CompositeATN<wchar_t>::~CompositeATN(&catn);
  return;
}

Assistant:

void Grammar<TCHAR>::print_ldfa(std::wostream& os, const ATNPath& path) const
{
    CompositeATN<TCHAR> catn(*this);

    LookaheadDFA<TCHAR> ldfa(catn, path);

    ldfa.print(os, path.leaf_id().str());
}